

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DarknetUtility.cpp
# Opt level: O1

void __thiscall
DarknetUtility::DarknetUtility
          (DarknetUtility *this,string *configPath,string *weightsPath,string *labelsPath)

{
  (this->configFilePath)._M_dataplus._M_p = (pointer)&(this->configFilePath).field_2;
  (this->configFilePath)._M_string_length = 0;
  (this->configFilePath).field_2._M_local_buf[0] = '\0';
  (this->weightsFilePath)._M_dataplus._M_p = (pointer)&(this->weightsFilePath).field_2;
  (this->weightsFilePath)._M_string_length = 0;
  (this->weightsFilePath).field_2._M_local_buf[0] = '\0';
  (this->labelsFilePath)._M_dataplus._M_p = (pointer)&(this->labelsFilePath).field_2;
  (this->labelsFilePath)._M_string_length = 0;
  (this->labelsFilePath).field_2._M_local_buf[0] = '\0';
  (this->colors).super__Vector_base<cv::Scalar_<double>,_std::allocator<cv::Scalar_<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->colors).super__Vector_base<cv::Scalar_<double>,_std::allocator<cv::Scalar_<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->colors).super__Vector_base<cv::Scalar_<double>,_std::allocator<cv::Scalar_<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->classes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->classes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->classes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cv::dnn::dnn4_v20211004::Net::Net(&this->net);
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->weightsFilePath);
  std::__cxx11::string::_M_assign((string *)&this->labelsFilePath);
  loadNetWork(this);
  loadClasses(this);
  generateRandomColors(this);
  return;
}

Assistant:

DarknetUtility::DarknetUtility(std::string configPath, std::string weightsPath, std::string labelsPath)
{
    this->configFilePath = configPath;
    this->weightsFilePath = weightsPath;
    this->labelsFilePath = labelsPath;
    loadNetWork();
    loadClasses();
    generateRandomColors();
}